

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O3

char * Saig_ObjName(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *__format;
  
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar2 & 7) - 7 < 0xfffffffe) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar2 = uVar2 & 7;
    if (uVar2 == 3) {
      uVar5 = (ulong)(uint)(pObj->field_0).CioId;
      uVar2 = p->nTruePos;
      uVar6 = (ulong)uVar2;
      if ((pObj->field_0).CioId < (int)uVar2) {
        if (1 < uVar2) {
          uVar6 = 0;
          uVar2 = uVar2 - 1;
          do {
            uVar6 = (ulong)((int)uVar6 + 1);
            bVar1 = 9 < uVar2;
            uVar2 = uVar2 / 10;
          } while (bVar1);
        }
        __format = "po%0*d";
        goto LAB_006ea59f;
      }
      uVar2 = p->nRegs;
      if (1 < uVar2) {
        uVar3 = uVar2 - 1;
        uVar2 = 0;
        do {
          uVar2 = uVar2 + 1;
          bVar1 = 9 < uVar3;
          uVar3 = uVar3 / 10;
        } while (bVar1);
      }
      iVar4 = Aig_ObjCioId(pObj);
      uVar3 = iVar4 - p->nTruePos;
      __format = "li%0*d";
    }
    else {
      if (uVar2 != 2) {
        if (uVar2 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIoa.c"
                        ,0x3c,"char *Saig_ObjName(Aig_Man_t *, Aig_Obj_t *)");
        }
        goto LAB_006ea564;
      }
      uVar5 = (ulong)(uint)(pObj->field_0).CioId;
      uVar2 = p->nTruePis;
      uVar6 = (ulong)uVar2;
      if ((pObj->field_0).CioId < (int)uVar2) {
        if (1 < uVar2) {
          uVar6 = 0;
          uVar2 = uVar2 - 1;
          do {
            uVar6 = (ulong)((int)uVar6 + 1);
            bVar1 = 9 < uVar2;
            uVar2 = uVar2 / 10;
          } while (bVar1);
        }
        __format = "pi%0*d";
        goto LAB_006ea59f;
      }
      uVar2 = p->nRegs;
      if (1 < uVar2) {
        uVar3 = uVar2 - 1;
        uVar2 = 0;
        do {
          uVar2 = uVar2 + 1;
          bVar1 = 9 < uVar3;
          uVar3 = uVar3 / 10;
        } while (bVar1);
      }
      iVar4 = Aig_ObjCioId(pObj);
      uVar3 = iVar4 - p->nTruePis;
      __format = "lo%0*d";
    }
    uVar6 = (ulong)uVar2;
    uVar5 = (ulong)uVar3;
  }
  else {
LAB_006ea564:
    uVar2 = p->vObjs->nSize;
    uVar6 = (ulong)uVar2;
    if (1 < uVar2) {
      uVar6 = 0;
      uVar2 = uVar2 - 1;
      do {
        uVar6 = (ulong)((int)uVar6 + 1);
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
    uVar5 = (ulong)(uint)pObj->Id;
    __format = "n%0*d";
  }
LAB_006ea59f:
  sprintf(Saig_ObjName::Buffer,__format,uVar6,uVar5);
  return Saig_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Saig_ObjName( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    static char Buffer[16];
    if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
        sprintf( Buffer, "n%0*d", Abc_Base10Log(Aig_ManObjNumMax(p)), Aig_ObjId(pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        sprintf( Buffer, "pi%0*d", Abc_Base10Log(Saig_ManPiNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsPo(p, pObj) )
        sprintf( Buffer, "po%0*d", Abc_Base10Log(Saig_ManPoNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsLo(p, pObj) )
        sprintf( Buffer, "lo%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPiNum(p) );
    else if ( Saig_ObjIsLi(p, pObj) )
        sprintf( Buffer, "li%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPoNum(p) );
    else 
        assert( 0 );
    return Buffer;
}